

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v6::internal::
       parse_arg_id<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  byte bVar1;
  specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_>
  *psVar2;
  int arg_id;
  unsigned_long_long uVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  basic_string_view<char> name;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  byte *local_78;
  precision_checker<fmt::v6::internal::error_handler> local_70;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  anon_union_16_15_055d57a1_for_value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_1
  local_48;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_78 = (byte *)begin;
  if (begin == end) {
    assert_fail(in_stack_ffffffffffffff80,0,in_stack_ffffffffffffff78);
  }
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    psVar2 = handler->handler;
    specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::get_arg(&local_48,
              &psVar2->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
             );
    local_68.long_long_value = local_48.long_long_value;
    local_68.string.size = local_48.string.size;
    local_58 = local_38;
    uStack_50 = uStack_30;
    local_70.handler_ = (error_handler *)&stack0xffffffffffffff87;
    uVar3 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                      (&local_70,
                       (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                        *)&local_68.string);
    if ((uVar3 & 0xffffffff80000000) != 0) {
LAB_0014828b:
      error_handler::on_error((error_handler *)&stack0xffffffffffffff87,"number is too big");
    }
    ((psVar2->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = (int)uVar3;
    pbVar6 = (byte *)begin;
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    if (bVar1 == 0x30) {
      local_78 = (byte *)(begin + 1);
      arg_id = 0;
    }
    else {
      arg_id = parse_nonnegative_int<char,fmt::v6::internal::precision_adapter<fmt::v6::internal::specs_checker<fmt::v6::internal::specs_handler<fmt::v6::basic_format_parse_context<char,fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>>&,char>&>
                         ((char **)&local_78,end,handler);
    }
    if ((local_78 == (byte *)end) || ((*local_78 != 0x3a && (*local_78 != 0x7d)))) {
LAB_0014829c:
      error_handler::on_error((error_handler *)&local_68.string,"invalid format string");
    }
    psVar2 = handler->handler;
    specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
    ::get_arg((format_arg *)&local_48.string,
              &psVar2->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
              ,arg_id);
    local_68.long_long_value = local_48.long_long_value;
    local_68.string.size = local_48.string.size;
    local_58 = local_38;
    uStack_50 = uStack_30;
    local_70.handler_ = (error_handler *)&stack0xffffffffffffff87;
    uVar3 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                      (&local_70,
                       (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                        *)&local_68.string);
    if ((uVar3 & 0xffffffff80000000) != 0) goto LAB_0014828b;
    ((psVar2->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = (int)uVar3;
    pbVar6 = local_78;
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_0014829c;
    pbVar5 = (byte *)(begin + 1);
    do {
      pbVar4 = pbVar5;
      pbVar6 = (byte *)end;
      if (pbVar4 == (byte *)end) break;
      bVar1 = *pbVar4;
      pbVar5 = pbVar4 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar6 = pbVar4, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    name.size_ = (long)pbVar6 - (long)begin;
    if ((long)name.size_ < 0) {
      assert_fail(in_stack_ffffffffffffff80,0,in_stack_ffffffffffffff78);
    }
    psVar2 = handler->handler;
    name.data_ = begin;
    basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>::arg
              ((format_arg *)&local_48.string,
               (psVar2->
               super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
               ).context_,name);
    local_68.long_long_value = local_48.long_long_value;
    local_68.string.size = local_48.string.size;
    local_58 = local_38;
    uStack_50 = uStack_30;
    local_70.handler_ = (error_handler *)&stack0xffffffffffffff87;
    uVar3 = visit_format_arg<fmt::v6::internal::precision_checker<fmt::v6::internal::error_handler>,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
                      (&local_70,
                       (basic_format_arg<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
                        *)&local_68.string);
    if ((uVar3 & 0xffffffff80000000) != 0) goto LAB_0014828b;
    ((psVar2->
     super_specs_handler<fmt::v6::basic_format_parse_context<char,_fmt::v6::internal::error_handler>,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
     ).super_specs_setter<char>.specs_)->precision = (int)uVar3;
  }
  return (char *)pbVar6;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = 0;
    if (c != '0')
      index = parse_nonnegative_int(begin, end, handler);
    else
      ++begin;
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}